

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O3

bbox * get_quad_bbox(void *primitive_data,size_t index)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  bbox *in_RDI;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  
  uVar1 = *(ulong *)((long)primitive_data + index * 0x48);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  fVar7 = *(float *)((long)primitive_data + index * 0x48 + 8);
  uVar2 = *(undefined8 *)((long)primitive_data + index * 0x48 + 0xc);
  fVar8 = fVar7 - *(float *)((long)primitive_data + index * 0x48 + 0x14);
  uVar3 = *(undefined8 *)((long)primitive_data + index * 0x48 + 0x18);
  fVar13 = *(float *)((long)primitive_data + index * 0x48 + 0x20) + fVar7;
  uVar4 = *(undefined8 *)((long)primitive_data + index * 0x48 + 0x24);
  fVar17 = *(float *)((long)primitive_data + index * 0x48 + 0x2c) + fVar7;
  fVar15 = fVar13;
  if (fVar17 <= fVar13) {
    fVar15 = fVar17;
  }
  if (fVar13 <= fVar17) {
    fVar13 = fVar17;
  }
  fVar17 = fVar8;
  if (fVar15 <= fVar8) {
    fVar17 = fVar15;
  }
  if (fVar8 <= fVar13) {
    fVar8 = fVar13;
  }
  fVar15 = (float)uVar1;
  fVar16 = (float)(uVar1 >> 0x20);
  auVar14._0_8_ = CONCAT44(fVar16 - (float)((ulong)uVar2 >> 0x20),fVar15 - (float)uVar2);
  auVar14._8_8_ = 0;
  auVar9._0_8_ = CONCAT44((float)((ulong)uVar3 >> 0x20) + fVar16,(float)uVar3 + fVar15);
  auVar9._8_8_ = 0;
  fVar15 = (float)uVar4 + fVar15;
  fVar16 = (float)((ulong)uVar4 >> 0x20) + fVar16;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar9._0_8_;
  auVar11._4_4_ = fVar16;
  auVar11._0_4_ = fVar15;
  auVar11._8_8_ = 0;
  auVar11 = minps(auVar10,auVar11);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar14._0_8_;
  auVar11 = minps(auVar18,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  auVar11 = minps(auVar12,auVar11);
  fVar13 = fVar7;
  if (fVar17 <= fVar7) {
    fVar13 = fVar17;
  }
  *(long *)(in_RDI->min)._ = auVar11._0_8_;
  (in_RDI->min)._[2] = fVar13;
  auVar5._4_4_ = fVar16;
  auVar5._0_4_ = fVar15;
  auVar5._8_8_ = 0;
  auVar11 = maxps(auVar9,auVar5);
  auVar11 = maxps(auVar14,auVar11);
  auVar6 = maxps(auVar6,auVar11);
  if (fVar7 <= fVar8) {
    fVar7 = fVar8;
  }
  *(long *)(in_RDI->max)._ = auVar6._0_8_;
  (in_RDI->max)._[2] = fVar7;
  return in_RDI;
}

Assistant:

static struct bbox get_quad_bbox(void* primitive_data, size_t index) {
    const struct quad* quad = &((const struct quad*)primitive_data)[index];
    return
        union_bbox(point_bbox(quad->p0),
        union_bbox(point_bbox(get_quad_p1(quad)),
        union_bbox(point_bbox(get_quad_p2(quad)),
            point_bbox(get_quad_p3(quad)))));
}